

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O0

void P_LoadVertexes(MapData *map)

{
  undefined1 auVar1 [16];
  DWORD DVar2;
  ulong uVar3;
  ulong uVar4;
  vertex_t *pvVar5;
  FileReader *this;
  vertex_t *local_48;
  short local_28;
  short local_26 [3];
  SWORD y;
  SWORD x;
  int local_14;
  MapData *pMStack_10;
  int i;
  MapData *map_local;
  
  pMStack_10 = map;
  DVar2 = MapData::Size(map,4);
  numvertexes = DVar2 >> 2;
  numvertexdatas = 0;
  if (numvertexes == 0) {
    I_Error("Map has no vertices.\n");
  }
  uVar3 = (ulong)numvertexes;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar3;
  uVar4 = SUB168(auVar1 * ZEXT816(0x38),0);
  if (SUB168(auVar1 * ZEXT816(0x38),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pvVar5 = (vertex_t *)operator_new__(uVar4);
  if (uVar3 != 0) {
    local_48 = pvVar5;
    do {
      vertex_t::vertex_t(local_48);
      local_48 = local_48 + 1;
    } while (local_48 != pvVar5 + uVar3);
  }
  vertexdatas = (vertexdata_t *)0x0;
  vertexes = pvVar5;
  MapData::Seek(pMStack_10,4);
  for (local_14 = 0; local_14 < numvertexes; local_14 = local_14 + 1) {
    this = FileReader::operator>>(pMStack_10->file,local_26);
    FileReader::operator>>(this,&local_28);
    vertex_t::set(vertexes + local_14,(double)(int)local_26[0],(double)(int)local_28);
  }
  return;
}

Assistant:

void P_LoadVertexes (MapData * map)
{
	int i;

	// Determine number of vertices:
	//	total lump length / vertex record length.
	numvertexes = map->Size(ML_VERTEXES) / sizeof(mapvertex_t);
	numvertexdatas = 0;

	if (numvertexes == 0)
	{
		I_Error ("Map has no vertices.\n");
	}

	// Allocate memory for buffer.
	vertexes = new vertex_t[numvertexes];		
	vertexdatas = NULL;

	map->Seek(ML_VERTEXES);
		
	// Copy and convert vertex coordinates, internal representation as fixed.
	for (i = 0; i < numvertexes; i++)
	{
		SWORD x, y;

		(*map->file) >> x >> y;
		vertexes[i].set(double(x), double(y));
	}
}